

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpgd.cpp
# Opt level: O1

void __thiscall jpgd::jpeg_decoder::prep_in_buffer(jpeg_decoder *this)

{
  uint8 *puVar1;
  uint8 *puVar2;
  int iVar3;
  uint8 *pD;
  long lVar4;
  long lVar5;
  
  this->m_in_buf_left = 0;
  this->m_pIn_buf_ofs = this->m_in_buf;
  if (this->m_eof_flag == false) {
    do {
      iVar3 = (*this->m_pStream->_vptr_jpeg_decoder_stream[2])
                        (this->m_pStream,this->m_in_buf + this->m_in_buf_left,
                         (ulong)(0x2000 - this->m_in_buf_left),&this->m_eof_flag);
      if (iVar3 == -1) {
        stop_decoding(this,JPGD_STREAM_READ);
      }
      lVar4 = (long)iVar3 + (long)this->m_in_buf_left;
      iVar3 = (int)lVar4;
      this->m_in_buf_left = iVar3;
    } while ((iVar3 < 0x2000) && (this->m_eof_flag != true));
    this->m_total_bytes_read = this->m_total_bytes_read + iVar3;
    puVar2 = this->m_pIn_buf_ofs;
    lVar5 = 0;
    do {
      puVar1 = puVar2 + lVar5 * 2 + lVar4;
      puVar1[0] = 0xff;
      puVar1[1] = 0xd9;
      puVar1[2] = 0xff;
      puVar1[3] = 0xd9;
      puVar1[4] = 0xff;
      puVar1[5] = 0xd9;
      puVar1[6] = 0xff;
      puVar1[7] = 0xd9;
      puVar1[8] = 0xff;
      puVar1[9] = 0xd9;
      puVar1[10] = 0xff;
      puVar1[0xb] = 0xd9;
      puVar1[0xc] = 0xff;
      puVar1[0xd] = 0xd9;
      puVar1[0xe] = 0xff;
      puVar1[0xf] = 0xd9;
      lVar5 = lVar5 + 8;
    } while (lVar5 != 0x40);
  }
  return;
}

Assistant:

void jpeg_decoder::prep_in_buffer() {
  m_in_buf_left = 0;
  m_pIn_buf_ofs = m_in_buf;

  if (m_eof_flag)
    return;

  do {
    int bytes_read = m_pStream->read(m_in_buf + m_in_buf_left, JPGD_IN_BUF_SIZE - m_in_buf_left, &m_eof_flag);
    if (bytes_read == -1)
      stop_decoding(JPGD_STREAM_READ);

    m_in_buf_left += bytes_read;
  } while ((m_in_buf_left < JPGD_IN_BUF_SIZE) && (!m_eof_flag));

  m_total_bytes_read += m_in_buf_left;

  // Pad the end of the block with M_EOI (prevents the decompressor from going off the rails if the stream is invalid).
  // (This dates way back to when this decompressor was written in C/asm, and the all-asm Huffman decoder did some fancy things to increase perf.)
  word_clear(m_pIn_buf_ofs + m_in_buf_left, 0xD9FF, 64);
}